

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time-dependency.t.cpp
# Opt level: O2

ostream * __thiscall
dynamicgraph::TimeDependency<int>::displayDependencies
          (TimeDependency<int> *this,ostream *os,int depth,string *space,string *next1,string *next2
          )

{
  DependencyType DVar1;
  SignalBase<int> *this_00;
  long *plVar2;
  int iVar3;
  ostream *poVar4;
  undefined4 extraout_var;
  Dependencies *pDVar5;
  _List_node_base *p_Var6;
  char *pcVar7;
  string ajout2;
  string ajout;
  string local_150 [32];
  string local_130 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90 [32];
  string local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = this->leader;
  std::__cxx11::string::string((string *)&local_b0,(string *)space);
  std::__cxx11::string::string((string *)&local_d0,(string *)next1);
  std::__cxx11::string::string((string *)&local_f0,(string *)next2);
  poVar4 = SignalBase<int>::displayDependencies(this_00,os,depth,&local_b0,&local_d0,&local_f0);
  std::operator<<(poVar4," (");
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  DVar1 = this->dependencyType;
  if (DVar1 == TIME_DEPENDENT) {
    poVar4 = std::operator<<(os,"t=");
    iVar3 = (*this->leader->_vptr_SignalBase[2])();
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,*(int *)CONCAT44(extraout_var,iVar3));
    poVar4 = std::operator<<(poVar4," (/");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->periodTime);
    pcVar7 = ") ";
  }
  else if (DVar1 == BOOL_DEPENDENT) {
    poVar4 = std::operator<<(os,"ready=");
    pcVar7 = "FALSE";
    if (this->leader->ready != false) {
      pcVar7 = "TRUE";
    }
  }
  else {
    if (DVar1 != ALWAYS_READY) goto LAB_0011fd63;
    pcVar7 = "A";
    poVar4 = os;
  }
  std::operator<<(poVar4,pcVar7);
LAB_0011fd63:
  std::operator<<(os,")");
  pDVar5 = &this->dependencies;
  p_Var6 = (_List_node_base *)pDVar5;
  while( true ) {
    p_Var6 = (((_List_base<const_dynamicgraph::SignalBase<int>_*,_std::allocator<const_dynamicgraph::SignalBase<int>_*>_>
                *)&p_Var6->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var6 == (_List_node_base *)pDVar5) {
      return os;
    }
    poVar4 = std::endl<char,std::char_traits<char>>(os);
    if (depth == 0) break;
    std::__cxx11::string::string<std::allocator<char>>(local_130,"|",(allocator<char> *)local_150);
    std::__cxx11::string::string<std::allocator<char>>(local_150,"|",(allocator<char> *)&local_110);
    if (p_Var6->_M_next == (_List_node_base *)pDVar5) {
      std::__cxx11::string::assign((char *)local_130);
      std::__cxx11::string::assign((char *)local_150);
    }
    plVar2 = (long *)p_Var6[1]._M_next;
    std::operator+(&local_110,space,next2);
    std::operator+(&local_50,&local_110,"   ");
    std::__cxx11::string::string(local_90,local_130);
    std::__cxx11::string::string(local_70,local_150);
    (**(code **)(*plVar2 + 0x58))(plVar2,os,depth + -1,&local_50,local_90,local_70);
    std::__cxx11::string::~string(local_70);
    std::__cxx11::string::~string(local_90);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string(local_150);
    std::__cxx11::string::~string(local_130);
  }
  poVar4 = std::operator<<(poVar4,(string *)space);
  std::operator<<(poVar4,"   `-- ...");
  return os;
}

Assistant:

std::ostream &TimeDependency<Time>::displayDependencies(
    std::ostream &os, const int depth, std::string space, std::string next1,
    std::string next2) const {
  leader.SignalBase<Time>::displayDependencies(os, depth, space, next1, next2)
      << " (";
  switch (dependencyType) {
    case ALWAYS_READY:
      os << "A";
      break;
    case BOOL_DEPENDENT:
      os << "ready=" << ((leader.getReady()) ? "TRUE" : "FALSE");
      break;
    case TIME_DEPENDENT:
      os << "t=" << leader.getTime() << " (/" << periodTime << ") ";
      break;
  };
  os << ")";  //<<std::endl;
  {
    const typename Dependencies::const_iterator itend = dependencies.end();
    for (typename Dependencies::const_iterator it = dependencies.begin();
         it != itend; ++it)
      if (depth != 0) {
        os << std::endl;
        std::string ajout = "|";
        std::string ajout2 = "|";
        typename Dependencies::const_iterator it2 = it;
        ++it2;
        if (it2 == dependencies.end()) {
          ajout = "`";
          ajout2 = " ";
        }
        (*it)->displayDependencies(os, depth - 1, space + next2 + "   ", ajout,
                                   ajout2);
      } else {
        os << std::endl << space << "   `-- ...";
        break;
      }
  }
  return os;
}